

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O2

void __thiscall WorkItemScheduler::WorkItemScheduler(WorkItemScheduler *this,size_t workers_nb)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  system_error *psVar4;
  errc *peVar5;
  long lVar6;
  mapped_type mVar7;
  error_code eVar8;
  error_code __ec;
  error_code __ec_00;
  error_code __ec_01;
  int socketfds [2];
  undefined1 local_4c [20];
  deque<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  *local_38;
  
  std::vector<Worker,_std::allocator<Worker>_>::vector
            (&this->workers_,workers_nb,(allocator_type *)local_4c);
  std::
  _Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ::_Deque_base(&(this->work_).
                 super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
               );
  (this->dispatcher_thread_)._M_id._M_thread = 0;
  this->epoll_fd_ = -1;
  this->active_ = false;
  local_4c._12_8_ = &this->fd_worker_map_;
  p_Var1 = &(this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = &this->work_;
  iVar2 = epoll_create1(0);
  this->epoll_fd_ = iVar2;
  if (iVar2 == -1) {
    psVar4 = (system_error *)__cxa_allocate_exception(0x20);
    peVar5 = (errc *)__errno_location();
    eVar8 = std::make_error_code(*peVar5);
    __ec_01._M_cat = eVar8._M_cat;
    __ec_01._4_4_ = 0;
    __ec_01._M_value = eVar8._M_value;
    std::system_error::system_error(psVar4,__ec_01,"Call to epoll_create1(2) failed");
    __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  lVar6 = 0;
  mVar7 = 0;
  while( true ) {
    if (workers_nb == mVar7) {
      return;
    }
    socketfds[0] = 0;
    socketfds[1] = 0;
    iVar2 = socketpair(1,5,0,socketfds);
    if (iVar2 == -1) break;
    local_4c._8_4_ = 0;
    local_4c._0_4_ = 1;
    local_4c._4_4_ = socketfds[0];
    iVar2 = epoll_ctl(this->epoll_fd_,1,socketfds[0],(epoll_event *)local_4c);
    if (iVar2 == -1) {
      close(socketfds[0]);
      close(socketfds[1]);
      psVar4 = (system_error *)__cxa_allocate_exception(0x20);
      peVar5 = (errc *)__errno_location();
      eVar8 = std::make_error_code(*peVar5);
      __ec_00._M_cat = eVar8._M_cat;
      __ec_00._4_4_ = 0;
      __ec_00._M_value = eVar8._M_value;
      std::system_error::system_error(psVar4,__ec_00,"Call to epoll_ctl(2) failed");
      __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    Worker::set_socketfd
              ((Worker *)
               ((long)&(((this->workers_).super__Vector_base<Worker,_std::allocator<Worker>_>.
                         _M_impl.super__Vector_impl_data._M_start)->thread)._M_id + lVar6),
               socketfds[1]);
    pmVar3 = std::
             map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                           *)local_4c._12_8_,socketfds);
    *pmVar3 = mVar7;
    mVar7 = mVar7 + 1;
    lVar6 = lVar6 + 0x60;
  }
  psVar4 = (system_error *)__cxa_allocate_exception(0x20);
  peVar5 = (errc *)__errno_location();
  eVar8 = std::make_error_code(*peVar5);
  __ec._M_cat = eVar8._M_cat;
  __ec._4_4_ = 0;
  __ec._M_value = eVar8._M_value;
  std::system_error::system_error(psVar4,__ec,"Call to socketpair(2) failed");
  __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

WorkItemScheduler::WorkItemScheduler(size_t workers_nb)
    : workers_(workers_nb)
{
    this->epoll_fd_ = epoll_create1(0);
    if (this->epoll_fd_ == -1)
        throw SYS_ERROR(errno, "Call to epoll_create1(2) failed");

    for (size_t i = 0; i < workers_nb; ++i)
    {
        int socketfds[2] = {0};
        if (socketpair(AF_UNIX, SOCK_SEQPACKET, 0, socketfds) == -1)
            throw SYS_ERROR(errno, "Call to socketpair(2) failed");

        struct epoll_event ev = {0};
        ev.events = EPOLLIN;
        ev.data.fd = socketfds[0];

        if (epoll_ctl(this->epoll_fd_, EPOLL_CTL_ADD, socketfds[0], &ev) == -1)
        {
            close(socketfds[0]);
            close(socketfds[1]);
            throw SYS_ERROR(errno, "Call to epoll_ctl(2) failed");
        }

        this->workers_[i].set_socketfd(socketfds[1]);
        this->fd_worker_map_[socketfds[0]] = i;
    }
}